

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O2

void gb_update_noise_channel(gb_sound_t *gb,SOUND *snd,UINT32 cycles)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  ushort uVar7;
  
  bVar1 = (gb->snd_4).reg[3];
  uVar3 = *(int *)(gb_noise_period_cycles_divisor + (ulong)(bVar1 & 7) * 4) << (bVar1 >> 4);
  uVar6 = cycles + snd->cycles_left;
  snd->cycles_left = uVar6;
  while (uVar3 <= uVar6) {
    snd->cycles_left = uVar6 - uVar3;
    uVar2 = snd->noise_lfsr >> 1;
    uVar7 = (snd->noise_lfsr ^ uVar2) & 1;
    uVar4 = uVar7 << 0xe;
    uVar5 = uVar4 | uVar2;
    snd->noise_lfsr = uVar5;
    if (snd->noise_short == true) {
      uVar5 = uVar7 << 6 | uVar4 | uVar2 & 0xffbf;
      snd->noise_lfsr = uVar5;
    }
    snd->signal = -((byte)uVar5 & 1) | 1;
    uVar6 = uVar6 - uVar3;
  }
  return;
}

Assistant:

static void gb_update_noise_channel(gb_sound_t *gb, struct SOUND *snd, UINT32 cycles)
{
	UINT32 period = gb_noise_period_cycles(gb);
	snd->cycles_left += cycles;
	while (snd->cycles_left >= period)
	{
		UINT16 feedback;
		snd->cycles_left -= period;

		// Using a Polynomial Counter (aka Linear Feedback Shift Register)
		// Mode 4 has a 15 bit counter so we need to shift the bits around accordingly.
		feedback = ((snd->noise_lfsr >> 1) ^ snd->noise_lfsr) & 1;
		snd->noise_lfsr = (snd->noise_lfsr >> 1) | (feedback << 14);
		if (snd->noise_short)
		{
			snd->noise_lfsr = (snd->noise_lfsr & ~(1 << 6)) | (feedback << 6);
		}
		snd->signal = (snd->noise_lfsr & 1) ? -1 : 1;
	}
}